

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_cmd.c
# Opt level: O0

int cfg_cmd_handle_set(cfg_instance *instance,cfg_db *db,char *arg,autobuf *log)

{
  int iVar1;
  cfg_entry *pcVar2;
  cfg_named_section *pcVar3;
  int local_88;
  _Bool local_81;
  int result;
  _Bool dummy;
  char *ptr;
  _parsed_argument pa;
  autobuf *log_local;
  char *arg_local;
  cfg_db *db_local;
  cfg_instance *instance_local;
  
  pa.entry_value = (char *)log;
  _result = strdup(arg);
  if (_result == (char *)0x0) {
    instance_local._0_4_ = -1;
  }
  else {
    local_88 = -1;
    iVar1 = _do_parse_arg(_result,(_parsed_argument *)&ptr,(autobuf *)pa.entry_value);
    if (iVar1 == 0) {
      if (pa.entry_key == (char *)0x0) {
        if (pa.section_name == (char *)0x0) {
          pcVar3 = _cfg_db_add_section(db,ptr,pa.section_type,&local_81);
          if (pcVar3 == (cfg_named_section *)0x0) {
            cfg_append_printable_line
                      ((autobuf *)pa.entry_value,"Cannot create section: \'%s\'\n",arg);
          }
          else {
            local_88 = 0;
          }
        }
        else {
          cfg_append_printable_line
                    ((autobuf *)pa.entry_value,
                     "Key without value is not allowed for set command: %s",arg);
        }
      }
      else {
        pcVar2 = cfg_db_set_entry_ext(db,ptr,pa.section_type,pa.section_name,pa.entry_key,true,true)
        ;
        if (pcVar2 == (cfg_entry *)0x0) {
          cfg_append_printable_line((autobuf *)pa.entry_value,"Cannot create entry: \'%s\'\n",arg);
        }
        local_88 = 0;
      }
    }
    free(_result);
    instance_local._0_4_ = local_88;
  }
  return (int)instance_local;
}

Assistant:

int
cfg_cmd_handle_set(
  struct cfg_instance *instance __attribute__((unused)), struct cfg_db *db, const char *arg, struct autobuf *log) {
  struct _parsed_argument pa;
  char *ptr;
  bool dummy;
  int result;

  /* get temporary copy of argument string */
  ptr = strdup(arg);
  if (!ptr)
    return -1;

  /* prepare for cleanup */
  result = -1;

  if (_do_parse_arg(ptr, &pa, log)) {
    goto handle_set_cleanup;
  }

  if (pa.entry_value != NULL) {
    if (cfg_db_set_entry(db, pa.section_type, pa.section_name, pa.entry_key, pa.entry_value, true)) {
      result = 0;
    }
    else {
      cfg_append_printable_line(log, "Cannot create entry: '%s'\n", arg);
    }
    result = 0;
    goto handle_set_cleanup;
  }

  if (pa.entry_key != NULL) {
    cfg_append_printable_line(log, "Key without value is not allowed for set command: %s", arg);
    goto handle_set_cleanup;
  }

  /* set section */
  if (NULL == _cfg_db_add_section(db, pa.section_type, pa.section_name, &dummy)) {
    cfg_append_printable_line(log, "Cannot create section: '%s'\n", arg);
    goto handle_set_cleanup;
  }
  result = 0;

handle_set_cleanup:
  free(ptr);
  return result;
}